

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceptance_tests.cpp
# Opt level: O0

NameVals * anon_unknown.dwarf_c87e::parseElem(NameVals *__return_storage_ptr__,string *elem)

{
  long lVar1;
  runtime_error *this;
  string local_c0;
  string local_a0;
  string local_80 [48];
  undefined1 local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> word;
  bool seenName;
  size_t dot;
  string *elem_local;
  NameVals *nameVals;
  
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
            (__return_storage_ptr__);
  word.field_2._M_local_buf[0xf] = '\0';
  do {
    lVar1 = std::__cxx11::string::find((char)elem,0x2e);
    std::__cxx11::string::substr((ulong)local_50,(ulong)elem);
    std::__cxx11::string::substr((ulong)local_80,(ulong)elem);
    std::__cxx11::string::operator=((string *)elem,local_80);
    std::__cxx11::string::~string(local_80);
    if ((word.field_2._M_local_buf[0xf] & 1U) == 0) {
      trim(&local_c0,(string *)local_50);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      word.field_2._M_local_buf[0xf] = '\x01';
    }
    else {
      trim(&local_a0,(string *)local_50);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&__return_storage_ptr__->second,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    std::__cxx11::string::~string((string *)local_50);
  } while (lVar1 != -1);
  if ((word.field_2._M_local_buf[0xf] & 1U) != 0) {
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Malformed assertion");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Assertion::NameVals parseElem(std::string elem) {
  Assertion::NameVals nameVals;
  size_t dot;
  auto seenName = false;
  do {
    dot = elem.find('.');
    auto word = elem.substr(0, dot);
    elem = elem.substr(dot+1);
    if (seenName) {
      nameVals.second.push_back(trim(word));
    } else {
      nameVals.first = trim(word);
      seenName = true;
    }
  } while (dot != string::npos);
  if (!seenName)
    throw std::runtime_error("Malformed assertion");
  return nameVals;
}